

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# desugarer.cpp
# Opt level: O1

Array * __thiscall jsonnet::internal::Desugarer::singleton(Desugarer *this,AST *body)

{
  Array *pAVar1;
  initializer_list<jsonnet::internal::Array::Element> __l;
  bool local_4a;
  allocator_type local_49;
  vector<jsonnet::internal::Array::Element,_std::allocator<jsonnet::internal::Array::Element>_>
  local_48;
  Element local_30;
  
  local_30.expr = body;
  ::std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
  ::vector(&local_30.commaFodder,
           (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
            *)EF);
  __l._M_len = 1;
  __l._M_array = &local_30;
  ::std::
  vector<jsonnet::internal::Array::Element,_std::allocator<jsonnet::internal::Array::Element>_>::
  vector(&local_48,__l,&local_49);
  local_4a = false;
  pAVar1 = Allocator::
           make<jsonnet::internal::Array,jsonnet::internal::LocationRange&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,std::vector<jsonnet::internal::Array::Element,std::allocator<jsonnet::internal::Array::Element>>,bool,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&>
                     (this->alloc,&body->location,
                      (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                       *)EF,&local_48,&local_4a,
                      (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                       *)EF);
  ::std::
  vector<jsonnet::internal::Array::Element,_std::allocator<jsonnet::internal::Array::Element>_>::
  ~vector(&local_48);
  ::std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
  ::~vector(&local_30.commaFodder);
  return pAVar1;
}

Assistant:

Array *singleton(AST *body)
    {
        return make<Array>(
            body->location, EF, Array::Elements{Array::Element(body, EF)}, false, EF);
    }